

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
fasttext::Loss::findKBest(Loss *this,int32_t k,real threshold,Predictions *heap,Vector *output)

{
  pointer *pppVar1;
  float fVar2;
  int iVar3;
  pointer pfVar4;
  iterator __position;
  pointer ppVar5;
  pointer ppVar6;
  bool bVar7;
  pointer pfVar8;
  undefined4 extraout_var;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  pair<float,_int> local_30;
  
  pfVar8 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar4 != pfVar8 && -1 < (long)pfVar4 - (long)pfVar8) {
    lVar13 = 0;
    do {
      if ((threshold <= pfVar8[lVar13]) &&
         (((long)(heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start >> 3 != (long)k ||
          (dVar14 = ::log((double)pfVar8[lVar13] + 1e-05),
          ((heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start)->first <= (float)dVar14)))) {
        dVar14 = ::log((double)(output->data_).super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar13] + 1e-05);
        local_30 = (pair<float,_int>)(CONCAT44(extraout_var,(float)dVar14) | lVar13 << 0x20);
        __position._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (heap->
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
          _M_realloc_insert<std::pair<float,int>>
                    ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,
                     __position,&local_30);
        }
        else {
          *__position._M_current = local_30;
          pppVar1 = &(heap->
                     super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
        ppVar5 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        fVar2 = ppVar5[-1].first;
        ppVar6 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar3 = ppVar5[-1].second;
        uVar9 = (long)ppVar5 - (long)ppVar6 >> 3;
        lVar10 = uVar9 - 1;
        if (1 < (long)uVar9) {
          do {
            lVar11 = (lVar10 - (lVar10 + -1 >> 0x3f)) + -1 >> 1;
            if (ppVar6[lVar11].first <= fVar2) break;
            ppVar6[lVar10].first = ppVar6[lVar11].first;
            ppVar6[lVar10].second = ppVar6[lVar11].second;
            bVar7 = 2 < lVar10;
            lVar10 = lVar11;
          } while (bVar7);
        }
        ppVar6[lVar10].first = fVar2;
        ppVar6[lVar10].second = iVar3;
        if ((ulong)(long)k < uVar9) {
          if (8 < (long)ppVar5 - (long)ppVar6) {
            fVar2 = ppVar5[-1].first;
            iVar3 = ppVar5[-1].second;
            ppVar5[-1].first = ppVar6->first;
            ppVar5[-1].second = ppVar6->second;
            uVar9 = (long)(ppVar5 + -1) - (long)ppVar6;
            lVar10 = (long)uVar9 >> 3;
            if (lVar10 < 3) {
              lVar11 = 0;
            }
            else {
              lVar12 = 0;
              do {
                if (ppVar6[lVar12 * 2 + 1].first < ppVar6[lVar12 * 2 + 2].first) {
                  lVar11 = lVar12 * 2 + 1;
                }
                else {
                  lVar11 = lVar12 * 2 + 2;
                }
                ppVar6[lVar12].first = ppVar6[lVar11].first;
                ppVar6[lVar12].second = ppVar6[lVar11].second;
                lVar12 = lVar11;
              } while (lVar11 < (lVar10 - (lVar10 + -1 >> 0x3f)) + -1 >> 1);
            }
            if (((uVar9 & 8) == 0) && (lVar11 == lVar10 + -2 >> 1)) {
              ppVar6[lVar11].first = ppVar6[lVar11 * 2 + 1].first;
              ppVar6[lVar11].second = ppVar6[lVar11 * 2 + 1].second;
              lVar11 = lVar11 * 2 + 1;
            }
            if (0 < lVar11) {
              do {
                lVar10 = (lVar11 - (lVar11 + -1 >> 0x3f)) + -1 >> 1;
                if (ppVar6[lVar10].first <= fVar2) break;
                ppVar6[lVar11].first = ppVar6[lVar10].first;
                ppVar6[lVar11].second = ppVar6[lVar10].second;
                bVar7 = 2 < lVar11;
                lVar11 = lVar10;
              } while (bVar7);
            }
            ppVar6[lVar11].first = fVar2;
            ppVar6[lVar11].second = iVar3;
          }
          (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
        }
      }
      lVar13 = lVar13 + 1;
      pfVar8 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar13 < (long)(output->data_).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pfVar8 >> 2);
  }
  return;
}

Assistant:

void Loss::findKBest(
    int32_t k,
    real threshold,
    Predictions& heap,
    const Vector& output) const {
  for (int32_t i = 0; i < output.size(); i++) {
    if (output[i] < threshold) {
      continue;
    }
    if (heap.size() == k && std_log(output[i]) < heap.front().first) {
      continue;
    }
    heap.push_back(std::make_pair(std_log(output[i]), i));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}